

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFileListGeneratorFixed::cmFileListGeneratorFixed(cmFileListGeneratorFixed *this,string *str)

{
  string *str_local;
  cmFileListGeneratorFixed *this_local;
  
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = (_func_int **)0x0;
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  cmFileListGeneratorBase::cmFileListGeneratorBase(&this->super_cmFileListGeneratorBase);
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorFixed_00b1c3d8;
  std::__cxx11::string::string((string *)&this->String,(string *)str);
  return;
}

Assistant:

cmFileListGeneratorFixed(std::string const& str):
    cmFileListGeneratorBase(), String(str) {}